

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O0

int mbedtls_arc4_self_test(int verbose)

{
  int iVar1;
  undefined1 local_12c [8];
  mbedtls_arc4_context ctx;
  uchar obuf [8];
  uchar ibuf [8];
  int ret;
  int i;
  int verbose_local;
  
  ibuf[0] = '\0';
  ibuf[1] = '\0';
  ibuf[2] = '\0';
  ibuf[3] = '\0';
  mbedtls_arc4_init((mbedtls_arc4_context *)local_12c);
  ibuf[4] = '\0';
  ibuf[5] = '\0';
  ibuf[6] = '\0';
  ibuf[7] = '\0';
  do {
    if (2 < (int)ibuf._4_4_) {
      if (verbose != 0) {
        printf(anon_var_dwarf_d0cd2 + 8);
      }
LAB_001de7fc:
      mbedtls_arc4_free((mbedtls_arc4_context *)local_12c);
      iVar1._0_1_ = ibuf[0];
      iVar1._1_1_ = ibuf[1];
      iVar1._2_1_ = ibuf[2];
      iVar1._3_1_ = ibuf[3];
      return iVar1;
    }
    if (verbose != 0) {
      printf("  ARC4 test #%d: ",(ulong)(ibuf._4_4_ + 1));
    }
    obuf = arc4_test_pt[(int)ibuf._4_4_];
    mbedtls_arc4_setup((mbedtls_arc4_context *)local_12c,arc4_test_key[(int)ibuf._4_4_],8);
    mbedtls_arc4_crypt((mbedtls_arc4_context *)local_12c,8,obuf,ctx.m + 0xf8);
    if ((uchar  [8])ctx.m._248_8_ != arc4_test_ct[(int)ibuf._4_4_]) {
      if (verbose != 0) {
        printf("failed\n");
      }
      ibuf[0] = '\x01';
      ibuf[1] = '\0';
      ibuf[2] = '\0';
      ibuf[3] = '\0';
      goto LAB_001de7fc;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    ibuf._4_4_ = ibuf._4_4_ + 1;
  } while( true );
}

Assistant:

int mbedtls_arc4_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char ibuf[8];
    unsigned char obuf[8];
    mbedtls_arc4_context ctx;

    mbedtls_arc4_init( &ctx );

    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ARC4 test #%d: ", i + 1 );

        memcpy( ibuf, arc4_test_pt[i], 8 );

        mbedtls_arc4_setup( &ctx, arc4_test_key[i], 8 );
        mbedtls_arc4_crypt( &ctx, 8, ibuf, obuf );

        if( memcmp( obuf, arc4_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_arc4_free( &ctx );

    return( ret );
}